

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_example.c
# Opt level: O0

dropt_error handle_face(dropt_context *context,dropt_option *option,char *optionArgument,void *dest)

{
  int iVar1;
  face_type *face;
  dropt_error err;
  void *dest_local;
  char *optionArgument_local;
  dropt_option *option_local;
  dropt_context *context_local;
  
  face._4_4_ = 0;
  if (dest == (void *)0x0) {
    __assert_fail("face != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/dropt_example.c"
                  ,0x92,
                  "dropt_error handle_face(dropt_context *, const dropt_option *, const char *, void *)"
                 );
  }
  if ((optionArgument == (char *)0x0) || (*optionArgument == '\0')) {
    face._4_4_ = 5;
  }
  else {
    iVar1 = strcmp(optionArgument,"heads");
    if (iVar1 == 0) {
      *(undefined4 *)dest = 1;
    }
    else {
      iVar1 = strcmp(optionArgument,"tails");
      if (iVar1 == 0) {
        *(undefined4 *)dest = 2;
      }
      else {
        face._4_4_ = 6;
      }
    }
  }
  return face._4_4_;
}

Assistant:

static dropt_error
handle_face(dropt_context* context,
            const dropt_option* option,
            const char* optionArgument,
            void* dest)
{
    dropt_error err = dropt_error_none;
    face_type* face = dest;
    assert(face != NULL);

    /* Option handlers should handle `optionArgument` being `NULL` (if the
     * option's argument is optional and wasn't supplied) or being the empty
     * string (if a user explicitly passed an empty string (e.g. --face="").
     */
    if (optionArgument == NULL || optionArgument[0] == '\0')
    {
        err = dropt_error_insufficient_arguments;
    }
    else if (strcmp(optionArgument, "heads") == 0)
    {
        *face = heads;
    }
    else if (strcmp(optionArgument, "tails") == 0)
    {
        *face = tails;
    }
    else
    {
        /* Reject the value as being inappropriate for this handler. */
        err = dropt_error_mismatch;
    }

    return err;
}